

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shuffling.hpp
# Opt level: O3

void Shell::Shuffling::
     shuffleArray<Lib::DArray<std::pair<Lib::List<unsigned_int>*,Lib::List<Kernel::TermList>*>>>
               (DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_> *a,
               uint len)

{
  undefined8 *puVar1;
  pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*> *ppVar2;
  List<unsigned_int> *pLVar3;
  List<Kernel::TermList> *pLVar4;
  List<Kernel::TermList> *pLVar5;
  result_type_conflict1 rVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  param_type local_38;
  
  if (len != 0) {
    uVar7 = len - 1;
    iVar8 = 0;
    lVar9 = 0;
    do {
      local_38 = (param_type)((ulong)uVar7 << 0x20);
      rVar6 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&local_38,&Lib::Random::_eng,&local_38);
      ppVar2 = a->_array;
      puVar1 = (undefined8 *)((long)&ppVar2->first + lVar9);
      pLVar3 = (List<unsigned_int> *)*puVar1;
      pLVar4 = (List<Kernel::TermList> *)puVar1[1];
      pLVar5 = ppVar2[(uint)(rVar6 + iVar8)].second;
      puVar1 = (undefined8 *)((long)&ppVar2->first + lVar9);
      *puVar1 = ppVar2[(uint)(rVar6 + iVar8)].first;
      puVar1[1] = pLVar5;
      ppVar2[(uint)(rVar6 + iVar8)].first = pLVar3;
      ppVar2[(uint)(rVar6 + iVar8)].second = pLVar4;
      lVar9 = lVar9 + 0x10;
      iVar8 = iVar8 + 1;
      uVar7 = uVar7 - 1;
    } while ((ulong)len << 4 != lVar9);
  }
  return;
}

Assistant:

static void shuffleArray(Arrayish& a, unsigned len) {
    for(unsigned i=0;i<len;i++){
      unsigned j = Random::getInteger(len-i)+i;
      std::swap(a[i],a[j]);
    }
  }